

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::hufDecode(longlong *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,
                       unsigned_short *out)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  byte *pbVar16;
  unsigned_short *outb;
  
  puVar1 = out + no;
  iVar13 = ni + 0xe;
  if (-1 < ni + 7) {
    iVar13 = ni + 7;
  }
  puVar8 = out;
  if (ni < 1) {
    iVar13 = 0;
    uVar15 = 0;
  }
  else {
    pbVar16 = (byte *)(in + (iVar13 >> 3));
    uVar15 = 0;
    iVar13 = 0;
    do {
      bVar5 = *in;
      in = (char *)((byte *)in + 1);
      uVar15 = (ulong)bVar5 | uVar15 << 8;
      iVar14 = iVar13 + 8;
      bVar4 = 5 < iVar13;
      iVar13 = iVar14;
      if (bVar4) {
        do {
          uVar6 = (ulong)(((uint)((long)uVar15 >> ((char)iVar13 - 0xeU & 0x3f)) & 0x3fff) << 4);
          iVar14 = *(int *)(&hdecod->field_0x0 + uVar6);
          uVar9 = iVar14 >> 8;
          if (iVar14 << 0x18 == 0) {
            lVar3 = *(long *)((long)&hdecod->p + uVar6);
            uVar6 = 0;
            if (lVar3 == 0) goto LAB_001258ec;
            if (0 < (int)uVar9) {
              uVar6 = 0;
              while( true ) {
                iVar14 = *(int *)(lVar3 + uVar6 * 4);
                uVar10 = (uint)hcode[iVar14] & 0x3f;
                for (; (iVar13 < (int)uVar10 && (in < pbVar16)); in = (char *)((byte *)in + 1)) {
                  uVar15 = (ulong)(byte)*in | uVar15 << 8;
                  iVar13 = iVar13 + 8;
                }
                if (((int)uVar10 <= iVar13) &&
                   (iVar11 = iVar13 - uVar10,
                   hcode[iVar14] >> 6 ==
                   (~(-1L << (sbyte)uVar10) & (long)uVar15 >> ((byte)iVar11 & 0x3f)))) break;
                uVar6 = uVar6 + 1;
                if (uVar6 == uVar9) goto LAB_001258d9;
              }
              if (iVar14 == rlc) {
                if (iVar11 < 8) {
                  bVar5 = *in;
                  in = (char *)((byte *)in + 1);
                  uVar15 = uVar15 << 8 | (ulong)bVar5;
                  iVar11 = iVar11 + 8;
                }
                iVar13 = iVar11 + -8;
                uVar12 = (long)uVar15 >> ((byte)iVar13 & 0x3f);
                if (puVar1 < puVar8 + (uVar12 & 0xff)) goto LAB_001258d9;
                if ((char)uVar12 != '\0') {
                  uVar2 = puVar8[-1];
                  do {
                    *puVar8 = uVar2;
                    puVar8 = puVar8 + 1;
                    bVar5 = (char)uVar12 - 1;
                    uVar12 = (ulong)bVar5;
                  } while (bVar5 != 0);
                }
              }
              else {
                if (puVar1 <= puVar8) goto LAB_001258d9;
                *puVar8 = (unsigned_short)iVar14;
                puVar8 = puVar8 + 1;
                iVar13 = iVar11;
              }
            }
            if ((uint)uVar6 == uVar9) goto LAB_001258d9;
          }
          else {
            iVar13 = iVar13 - ((iVar14 << 0x18) >> 0x18);
            if (uVar9 == rlc) {
              if (iVar13 < 8) {
                bVar5 = *in;
                in = (char *)((byte *)in + 1);
                uVar15 = uVar15 << 8 | (ulong)bVar5;
                iVar13 = iVar13 + 8;
              }
              iVar13 = iVar13 + -8;
              uVar6 = (long)uVar15 >> ((byte)iVar13 & 0x3f);
              if (puVar1 < puVar8 + (uVar6 & 0xff)) goto LAB_001258d9;
              if ((char)uVar6 != '\0') {
                uVar2 = puVar8[-1];
                do {
                  *puVar8 = uVar2;
                  puVar8 = puVar8 + 1;
                  bVar5 = (char)uVar6 - 1;
                  uVar6 = (ulong)bVar5;
                } while (bVar5 != 0);
              }
            }
            else {
              if (puVar1 <= puVar8) goto LAB_001258d9;
              *puVar8 = (unsigned_short)((uint)iVar14 >> 8);
              puVar8 = puVar8 + 1;
            }
          }
        } while (0xd < iVar13);
      }
    } while (in < pbVar16);
  }
  uVar9 = -ni & 7;
  iVar14 = iVar13 - uVar9;
  if (iVar14 != 0 && (int)uVar9 <= iVar13) {
    uVar15 = (long)uVar15 >> (sbyte)uVar9;
    do {
      while( true ) {
        iVar13 = *(int *)(&hdecod->field_0x0 +
                         (((uint)(uVar15 << (0xeU - (char)iVar14 & 0x3f)) & 0x3fff) << 4));
        if (iVar13 << 0x18 == 0) goto LAB_001258d9;
        iVar11 = iVar14 - ((iVar13 << 0x18) >> 0x18);
        if (iVar13 >> 8 == rlc) break;
        if (puVar1 <= puVar8) goto LAB_001258d9;
        *puVar8 = (unsigned_short)((uint)iVar13 >> 8);
        puVar8 = puVar8 + 1;
        iVar14 = iVar11;
        if (iVar11 < 1) goto LAB_001258e0;
      }
      if (iVar11 < 8) {
        bVar5 = *in;
        in = (char *)((byte *)in + 1);
        uVar15 = uVar15 << 8 | (ulong)bVar5;
        iVar11 = iVar11 + 8;
      }
      iVar14 = iVar11 + -8;
      uVar6 = (long)uVar15 >> ((byte)iVar14 & 0x3f);
      if (puVar1 < puVar8 + (uVar6 & 0xff)) goto LAB_001258d9;
      if ((char)uVar6 != '\0') {
        uVar2 = puVar8[-1];
        puVar7 = puVar8;
        do {
          puVar8 = puVar7 + 1;
          *puVar7 = uVar2;
          bVar5 = (char)uVar6 - 1;
          uVar6 = (ulong)bVar5;
          puVar7 = puVar8;
        } while (bVar5 != 0);
      }
    } while (8 < iVar11);
  }
LAB_001258e0:
  uVar6 = (ulong)((long)puVar8 - (long)out >> 1 == (long)no);
LAB_001258ec:
  return SUB81(uVar6,0);
LAB_001258d9:
  uVar6 = 0;
  goto LAB_001258ec;
}

Assistant:

bool hufDecode(const long long *hcode,  // i : encoding table
               const HufDec *hdecod,    // i : decoding table
               const char *in,          // i : compressed input buffer
               int ni,                  // i : input size (in bits)
               int rlc,                 // i : run-length code
               int no,                  // i : expected output size (in bytes)
               unsigned short *out)     //  o: uncompressed output buffer
{
  long long c = 0;
  int lc = 0;
  unsigned short *outb = out;
  unsigned short *oe = out + no;
  const char *ie = in + (ni + 7) / 8;  // input byte size

  //
  // Loop on input bytes
  //

  while (in < ie) {
    getChar(c, lc, in);

    //
    // Access decoding table
    //

    while (lc >= HUF_DECBITS) {
      const HufDec pl = hdecod[(c >> (lc - HUF_DECBITS)) & HUF_DECMASK];

      if (pl.len) {
        //
        // Get short code
        //

        lc -= pl.len;
        getCode(pl.lit, rlc, c, lc, in, out, oe);
      } else {
        if (!pl.p) {
          return false;
        }
        // invalidCode(); // wrong code

        //
        // Search long code
        //

        int j;

        for (j = 0; j < pl.lit; j++) {
          int l = hufLength(hcode[pl.p[j]]);

          while (lc < l && in < ie)  // get more bits
            getChar(c, lc, in);

          if (lc >= l) {
            if (hufCode(hcode[pl.p[j]]) ==
                ((c >> (lc - l)) & (((long long)(1) << l) - 1))) {
              //
              // Found : get long code
              //

              lc -= l;
              getCode(pl.p[j], rlc, c, lc, in, out, oe);
              break;
            }
          }
        }

        if (j == pl.lit) {
          return false;
          // invalidCode(); // Not found
        }
      }
    }
  }

  //
  // Get remaining (short) codes
  //

  int i = (8 - ni) & 7;
  c >>= i;
  lc -= i;

  while (lc > 0) {
    const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

    if (pl.len) {
      lc -= pl.len;
      getCode(pl.lit, rlc, c, lc, in, out, oe);
    } else {
      return false;
      // invalidCode(); // wrong (long) code
    }
  }

  if (out - outb != no) {
    return false;
  }
  // notEnoughData ();

  return true;
}